

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECCurveTest_P224Bug_Test::TestBody(ECCurveTest_P224Bug_Test *this)

{
  AssertionResult *pAVar1;
  int iVar2;
  EC_POINT *src;
  pointer *__ptr;
  long *plVar3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *message;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar__8;
  AssertHelper local_f8;
  AssertionResult gtest_ar_1;
  AssertHelper local_d0;
  UniquePtr<BIGNUM> bn32;
  UniquePtr<BIGNUM> bn31;
  UniquePtr<EC_POINT> ret;
  UniquePtr<EC_POINT> p;
  EC_SCALAR sc31;
  EC_SCALAR sc32;
  
  src = EC_GROUP_get0_generator((EC_GROUP *)(this->super_ECCurveTest).group_);
  p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
       EC_POINT_dup(src,(EC_GROUP *)(this->super_ECCurveTest).group_);
  sc32.words[1] = 0;
  sc32.words[0]._0_1_ =
       (tuple<ec_point_st_*,_bssl::internal::Deleter>)
       p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
  if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
      p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sc31,(internal *)&sc32,(AssertionResult *)0x4c5fec,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x396,(char *)CONCAT71(sc31.words[0]._1_7_,(char)sc31.words[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8,(Message *)&gtest_ar_1);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(sc32.words + 1));
    iVar2 = EC_POINT_invert((EC_GROUP *)(this->super_ECCurveTest).group_,
                            (EC_POINT *)
                            p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,(BN_CTX *)0x0);
    sc32.words[1] = 0;
    sc32.words[0]._0_1_ = iVar2 != 0;
    if (iVar2 != 0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(sc32.words + 1));
      ret._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
           EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
      sc32.words[1] = 0;
      sc32.words[0]._0_1_ =
           (tuple<ec_point_st_*,_bssl::internal::Deleter>)
           ret._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
      if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
          ret._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&gtest_ar_1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&sc31,(internal *)&sc32,(AssertionResult *)0x4c635d,"false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x39b,(char *)CONCAT71(sc31.words[0]._1_7_,(char)sc31.words[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__8,(Message *)&gtest_ar_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8);
        std::__cxx11::string::~string((string *)&sc31);
        if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(sc32.words + 1));
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(sc32.words + 1));
        bn31._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
        bn32._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
        sc32.words[1] = 0;
        sc32.words[0]._0_1_ =
             (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
             bn31._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
            bn31._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&sc31,(internal *)&sc32,(AssertionResult *)"bn31","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x39d,(char *)CONCAT71(sc31.words[0]._1_7_,(char)sc31.words[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__8,(Message *)&gtest_ar_1);
LAB_002a334c:
          pAVar1 = (AssertionResult *)&sc32;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8);
          std::__cxx11::string::~string((string *)&sc31);
          plVar3 = (long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_);
LAB_002a3363:
          this_00 = &pAVar1->message_;
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 8))();
          }
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(sc32.words + 1));
          sc32.words[1] = 0;
          sc32.words[0]._0_1_ =
               (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
               bn32._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
          if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
              bn32._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&gtest_ar_1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&sc31,(internal *)&sc32,(AssertionResult *)"bn32","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x39e,(char *)CONCAT71(sc31.words[0]._1_7_,(char)sc31.words[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__8,(Message *)&gtest_ar_1);
            goto LAB_002a334c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(sc32.words + 1));
          iVar2 = BN_set_word((BIGNUM *)
                              bn31._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x1f);
          sc32.words[1] = 0;
          sc32.words[0]._0_1_ = iVar2 != 0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&gtest_ar_1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&sc31,(internal *)&sc32,
                       (AssertionResult *)"BN_set_word(bn31.get(), 31)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x39f,(char *)CONCAT71(sc31.words[0]._1_7_,(char)sc31.words[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__8,(Message *)&gtest_ar_1);
            goto LAB_002a334c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(sc32.words + 1));
          iVar2 = BN_set_word((BIGNUM *)
                              bn32._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x20);
          sc32.words[1] = 0;
          sc32.words[0]._0_1_ = iVar2 != 0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&gtest_ar_1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&sc31,(internal *)&sc32,
                       (AssertionResult *)"BN_set_word(bn32.get(), 32)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a0,(char *)CONCAT71(sc31.words[0]._1_7_,(char)sc31.words[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__8,(Message *)&gtest_ar_1);
            goto LAB_002a334c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(sc32.words + 1));
          pcVar4 = (char *)0x0;
          iVar2 = EC_POINT_mul((EC_GROUP *)(this->super_ECCurveTest).group_,
                               (EC_POINT *)
                               ret._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                               (BIGNUM *)
                               bn32._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                               (EC_POINT *)
                               p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                               (BIGNUM *)
                               bn31._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BN_CTX *)0x0)
          ;
          sc32.words[1] = 0;
          sc32.words[0]._0_1_ = iVar2 != 0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&gtest_ar_1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&sc31,(internal *)&sc32,
                       (AssertionResult *)
                       "EC_POINT_mul(group(), ret.get(), bn32.get(), p.get(), bn31.get(), nullptr)",
                       "false","true",pcVar4);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a2,(char *)CONCAT71(sc31.words[0]._1_7_,(char)sc31.words[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__8,(Message *)&gtest_ar_1);
            goto LAB_002a334c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(sc32.words + 1));
          sc32.words[0]._0_4_ = 0;
          gtest_ar_1._0_4_ =
               EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                            (EC_POINT *)
                            ret._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,src,
                            (BN_CTX *)0x0);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&sc31,"0","EC_POINT_cmp(group(), ret.get(), g, nullptr)",
                     (int *)&sc32,(int *)&gtest_ar_1);
          if ((char)sc31.words[0] == '\0') {
            testing::Message::Message((Message *)&sc32);
            if (sc31.words[1] == 0) {
              message = "";
            }
            else {
              message = *(char **)sc31.words[1];
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a3,message);
            testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&sc32)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
            if ((long *)CONCAT44(sc32.words[0]._4_4_,(undefined4)sc32.words[0]) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(sc32.words[0]._4_4_,(undefined4)sc32.words[0]) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(sc31.words + 1));
          iVar2 = ec_bignum_to_scalar((this->super_ECCurveTest).group_,&sc31,
                                      (BIGNUM *)
                                      bn31._M_t.
                                      super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
          gtest_ar__8.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__8.success_ = iVar2 != 0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1,(internal *)&gtest_ar__8,
                       (AssertionResult *)"ec_bignum_to_scalar(group(), &sc31, bn31.get())","false",
                       "true",pcVar4);
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a8,(char *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_));
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
LAB_002a3624:
            pAVar1 = &gtest_ar__8;
            testing::internal::AssertHelper::~AssertHelper(&local_d0);
            std::__cxx11::string::~string((string *)&gtest_ar_1);
            plVar3 = (long *)CONCAT44(local_f8.data_._4_4_,(int)local_f8.data_);
            goto LAB_002a3363;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__8.message_);
          iVar2 = ec_bignum_to_scalar((this->super_ECCurveTest).group_,&sc32,
                                      (BIGNUM *)
                                      bn32._M_t.
                                      super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
          gtest_ar__8.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__8.success_ = iVar2 != 0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1,(internal *)&gtest_ar__8,
                       (AssertionResult *)"ec_bignum_to_scalar(group(), &sc32, bn32.get())","false",
                       "true",pcVar4);
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a9,(char *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_));
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
            goto LAB_002a3624;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__8.message_);
          iVar2 = ec_point_mul_scalar_public
                            ((this->super_ECCurveTest).group_,
                             (EC_JACOBIAN *)
                             ((long)ret._M_t.
                                    super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8),
                             &sc32,(EC_JACOBIAN *)
                                   ((long)p._M_t.
                                          super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl
                                   + 8),&sc31);
          gtest_ar__8.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__8.success_ = iVar2 != 0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1,(internal *)&gtest_ar__8,
                       (AssertionResult *)
                       "ec_point_mul_scalar_public(group(), &ret->raw, &sc32, &p->raw, &sc31)",
                       "false","true",pcVar4);
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3ab,(char *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_));
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
            goto LAB_002a3624;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__8.message_);
          gtest_ar__8.success_ = false;
          gtest_ar__8._1_3_ = 0;
          local_f8.data_._0_4_ =
               EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                            (EC_POINT *)
                            ret._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,src,
                            (BN_CTX *)0x0);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar_1,"0","EC_POINT_cmp(group(), ret.get(), g, nullptr)",
                     (int *)&gtest_ar__8,(int *)&local_f8);
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__8);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3ac,pcVar4);
            testing::internal::AssertHelper::operator=(&local_f8,(Message *)&gtest_ar__8);
            testing::internal::AssertHelper::~AssertHelper(&local_f8);
            if ((long *)CONCAT44(gtest_ar__8._4_4_,gtest_ar__8._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar__8._4_4_,gtest_ar__8._0_4_) + 8))();
            }
          }
          this_00 = &gtest_ar_1.message_;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_00);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn32);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn31);
      }
      std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
      goto LAB_002a3394;
    }
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sc31,(internal *)&sc32,
               (AssertionResult *)"EC_POINT_invert(group(), p.get(), nullptr)","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x397,(char *)CONCAT71(sc31.words[0]._1_7_,(char)sc31.words[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8,(Message *)&gtest_ar_1);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8);
  std::__cxx11::string::~string((string *)&sc31);
  if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(sc32.words + 1));
LAB_002a3394:
  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&p);
  return;
}

Assistant:

TEST_P(ECCurveTest, P224Bug) {
  // P = -G
  const EC_POINT *g = EC_GROUP_get0_generator(group());
  bssl::UniquePtr<EC_POINT> p(EC_POINT_dup(g, group()));
  ASSERT_TRUE(p);
  ASSERT_TRUE(EC_POINT_invert(group(), p.get(), nullptr));

  // Compute 31 * P + 32 * G = G
  bssl::UniquePtr<EC_POINT> ret(EC_POINT_new(group()));
  ASSERT_TRUE(ret);
  bssl::UniquePtr<BIGNUM> bn31(BN_new()), bn32(BN_new());
  ASSERT_TRUE(bn31);
  ASSERT_TRUE(bn32);
  ASSERT_TRUE(BN_set_word(bn31.get(), 31));
  ASSERT_TRUE(BN_set_word(bn32.get(), 32));
  ASSERT_TRUE(EC_POINT_mul(group(), ret.get(), bn32.get(), p.get(), bn31.get(),
                           nullptr));
  EXPECT_EQ(0, EC_POINT_cmp(group(), ret.get(), g, nullptr));

  // Repeat the computation with |ec_point_mul_scalar_public|, which ties the
  // additions together.
  EC_SCALAR sc31, sc32;
  ASSERT_TRUE(ec_bignum_to_scalar(group(), &sc31, bn31.get()));
  ASSERT_TRUE(ec_bignum_to_scalar(group(), &sc32, bn32.get()));
  ASSERT_TRUE(
      ec_point_mul_scalar_public(group(), &ret->raw, &sc32, &p->raw, &sc31));
  EXPECT_EQ(0, EC_POINT_cmp(group(), ret.get(), g, nullptr));
}